

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LenInstruction.cpp
# Opt level: O1

int get_ins_len(char f,char s)

{
  int iVar1;
  undefined4 *puVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,f);
  if (0x3f < iVar1) {
    if (iVar1 < 0x50) {
      if (iVar1 - 0x40U < 5) goto LAB_0010482b;
    }
    else if (iVar1 < 0x60) {
      if ((iVar1 == 0x50) || (iVar1 == 0x51)) {
        if (s < 'E') goto LAB_0010482b;
      }
      else if (iVar1 == 0x5f) {
        return 1;
      }
    }
    else {
      if ((iVar1 == 0x60) || (iVar1 == 0x61)) goto LAB_0010482b;
      if (iVar1 == 0x70) {
        return 1;
      }
    }
LAB_00104839:
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xf6;
    __cxa_throw(puVar2,&int::typeinfo,0);
  }
  if (iVar1 < 0x25) {
    if (iVar1 < 0x20) {
      if (iVar1 == -0x20) {
        return 2;
      }
      if (iVar1 != 0x10) {
        if (iVar1 == 0x11) {
          return 2;
        }
        goto LAB_00104839;
      }
    }
    else if ('B' < s) {
      return 2;
    }
  }
  else {
    if (iVar1 - 0x30U < 2) {
      return 2;
    }
    if (iVar1 == 0x25) {
      return 2;
    }
    if ((iVar1 != 0x32) || ('B' < s)) goto LAB_00104839;
  }
LAB_0010482b:
  iVar1 = _ins_len(s);
  return iVar1 + 2;
}

Assistant:

int get_ins_len(char f, char s) {
	uint8_t f1 = (uint8_t)f;
	switch (f1)
	{
	case INS_MOV: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_LEA: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_INT: {
		//
		return 2;
	}
	case INS_JMP:case INS_JZ:case INS_JNZ:case INS_JH:case INS_JL: {
		return 2 + _ins_len(s);
	}
	case INS_INC:case INS_DEC: {
		return 2;
	}
	case INS_CMP: {
		if (s <= '\x42') return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_ADD: case INS_SUB:case INS_XOR:case INS_AND:case INS_OR: {
		if (s <= '\x42')
		{
			return	2 + _ins_len(s);
		}
	}
	case INS_NOT: {
		return 2;
	}
	case INS_NOP: {
		return 1;
	}
	case INS_PUSH: {
		return 2 + _ins_len(s);
	}
	case INS_POP: {
		return 2;
	}
	case INS_CALL: {
		return 2 + _ins_len(s);
	}
	case INS_RET: {
		return 2 + _ins_len(s);
	}
	case INS_JIT_IN: {
		return 1;
	}
	default: {
		break;
	}

	}
	throw(LVM_EXECUTE_ERROR);
}